

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HonokaMiku.cc
# Opt level: O3

int msvcr110_strnicmp(char *first,char *last,size_t count)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  if (count != 0) {
    lVar4 = 0;
    do {
      bVar1 = first[lVar4];
      uVar2 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        uVar2 = (uint)bVar1;
      }
      bVar1 = last[lVar4];
      uVar3 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        uVar3 = (uint)bVar1;
      }
    } while (((count - 1 != lVar4) && (uVar2 != 0)) && (lVar4 = lVar4 + 1, uVar2 == uVar3));
    return uVar2 - uVar3;
  }
  return 0;
}

Assistant:

int msvcr110_strnicmp (const char * first, const char * last, size_t count)
{
    if(count)
    {
        int f=0;
        int l=0;

        do
        {
            if ( ((f = (unsigned char)(*(first++))) >= 'A') &&
                    (f <= 'Z') )
                f -= 'A' - 'a';

            if ( ((l = (unsigned char)(*(last++))) >= 'A') &&
                    (l <= 'Z') )
                l -= 'A' - 'a';
        }
        while ( --count && f && (f == l) );

        return ( f - l );
    }
    else
    {
        return 0;
    }
}